

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O0

stumpless_param * stumpless_set_param_name(stumpless_param *param,char *name)

{
  _Bool _Var1;
  size_t local_28;
  size_t new_size;
  char *name_local;
  stumpless_param *param_local;
  
  new_size = (size_t)name;
  name_local = param->name;
  if (param == (stumpless_param *)0x0) {
    raise_argument_empty("param was NULL");
    param_local = (stumpless_param *)0x0;
  }
  else if (name == (char *)0x0) {
    raise_argument_empty("name was NULL");
    param_local = (stumpless_param *)0x0;
  }
  else {
    _Var1 = validate_param_name(name,&local_28);
    if (_Var1) {
      lock_param((stumpless_param *)name_local);
      *(size_t *)(name_local + 0x28) = local_28;
      memcpy(name_local,(void *)new_size,local_28);
      name_local[local_28] = '\0';
      unlock_param((stumpless_param *)name_local);
      clear_error();
      param_local = (stumpless_param *)name_local;
    }
    else {
      param_local = (stumpless_param *)0x0;
    }
  }
  return param_local;
}

Assistant:

struct stumpless_param *
stumpless_set_param_name( struct stumpless_param *param, const char *name ) {
  size_t new_size;

  VALIDATE_ARG_NOT_NULL( param );
  VALIDATE_ARG_NOT_NULL( name );

  if( unlikely( !validate_param_name( name, &new_size ) ) ) {
    goto fail;
  }

  lock_param( param );
  param->name_length = new_size;
  memcpy( param->name, name, new_size );
  param->name[new_size] = '\0';
  unlock_param( param );

  clear_error(  );
  return param;

fail:
  return NULL;
}